

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManEquivToChoices(Gia_Man_t *p,int nSnapshots)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Rpr_t *pGVar8;
  int *piVar9;
  long lVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  
  if (p->vCos->nSize % nSnapshots != 0) {
    __assert_fail("(Gia_ManCoNum(p) % nSnapshots) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x7bc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
  }
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  sVar6 = (size_t)p->nObjs;
  pGVar8 = (Gia_Rpr_t *)calloc(sVar6,4);
  p_00->pReprs = pGVar8;
  piVar9 = (int *)calloc(sVar6,4);
  p_00->pNexts = piVar9;
  if (0 < (long)sVar6) {
    lVar10 = 0;
    do {
      p_00->pReprs[lVar10] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar10] | 0xfffffff);
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nObjs);
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  uVar14 = pVVar12->nSize;
  uVar15 = (ulong)uVar14;
  if (0 < (int)uVar14) {
    lVar10 = 0;
    do {
      uVar14 = (uint)uVar15;
      iVar1 = pVVar12->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202ca3;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_00202cc2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00202cc2;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
      pVVar12 = p->vCis;
      uVar14 = pVVar12->nSize;
      uVar15 = (ulong)(int)uVar14;
    } while (lVar10 < (long)uVar15);
  }
  lVar10 = (long)p->nRegs;
  if (0 < lVar10) {
    uVar16 = uVar14 - p->nRegs;
    uVar15 = (ulong)uVar16;
    do {
      if (((int)uVar15 < 0) || ((int)uVar14 <= (int)uVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar17 = (long)pVVar12->pArray[uVar15];
      if ((lVar17 < 0) || (p->nObjs <= pVVar12->pArray[uVar15])) goto LAB_00202ca3;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar18 = (ulong)(uint)p->pReprs[lVar17] & 0xfffffff;
      if (uVar18 != 0xfffffff) {
        if ((uint)p->nObjs <= (uint)uVar18) goto LAB_00202ca3;
        uVar5 = *(ulong *)(pGVar3 + uVar18);
        if (((~uVar5 & 0x1fffffff1fffffff) != 0) &&
           ((((uint)uVar5 & 0x9fffffff) != 0x9fffffff ||
            ((int)((uint)(uVar5 >> 0x20) & 0x1fffffff) < (int)uVar16)))) {
          __assert_fail("Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x7cc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
        }
        pGVar3[lVar17].Value = pGVar3[uVar18].Value;
      }
      uVar15 = uVar15 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  Gia_ManHashAlloc(p_00);
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar10 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202ca3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      Gia_ManEquivToChoices_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar10 = lVar10 + 1;
      pVVar12 = p->vCos;
    } while (lVar10 < pVVar12->nSize);
  }
  pVVar12 = Gia_ManGetDangling(p);
  if (0 < pVVar12->nSize) {
    lVar10 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202ca3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManEquivToChoices_rec(p_00,p,p->pObjs + iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar12->nSize);
  }
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    uVar15 = 0;
    do {
      iVar1 = pVVar12->pArray[uVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00202ca3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) %
               (long)nSnapshots) == 0) {
        pGVar3 = p->pObjs + iVar1;
        uVar16 = (uint)*(undefined8 *)pGVar3;
        uVar14 = pGVar3[-(ulong)(uVar16 & 0x1fffffff)].Value;
        if ((int)uVar14 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar14);
        pVVar12 = p->vCos;
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)pVVar12->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManRemoveBadChoices(p_00);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManEquivToChoices( Gia_Man_t * p, int nSnapshots )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    int i;
//Gia_ManEquivPrintClasses( p, 0, 0 );
    assert( (Gia_ManCoNum(p) % nSnapshots) == 0 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            assert( Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr) );
            pObj->Value = pRepr->Value;
        }
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    vNodes = Gia_ManGetDangling( p );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, pObj );
    Vec_IntFree( vNodes );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nSnapshots == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManRemoveBadChoices( pNew );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    return pNew;
}